

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)

{
  bool bVar1;
  SQObjectPtr *closure;
  SQRESULT SVar2;
  SQObjectPtr res;
  SQObjectPtr local_30;
  
  local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_30.super_SQObject._type = OT_NULL;
  closure = SQVM::GetUp(v,~params);
  bVar1 = SQVM::Call(v,closure,params,v->_top - params,&local_30,(ulong)(raiseerror != 0));
  if (bVar1) {
    if (v->_suspended == 0) {
      SQVM::Pop(v,params);
    }
    if (retval != 0) {
      SQVM::Push(v,&local_30);
    }
    SVar2 = 0;
  }
  else {
    SVar2 = -1;
    SQVM::Pop(v,params);
  }
  SQObjectPtr::~SQObjectPtr(&local_30);
  return SVar2;
}

Assistant:

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)
{
    SQObjectPtr res;
    if(!v->Call(v->GetUp(-(params+1)),params,v->_top-params,res,raiseerror?true:false)){
        v->Pop(params); //pop args
        return SQ_ERROR;
    }
    if(!v->_suspended)
        v->Pop(params); //pop args
    if(retval)
        v->Push(res); // push result
    return SQ_OK;
}